

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv_error.hpp
# Opt level: O0

char * __thiscall jsoncons::conv_error::what(conv_error *this)

{
  ulong uVar1;
  long in_RDI;
  string local_80 [24];
  unsigned_long in_stack_ffffffffffffff98;
  string local_60 [32];
  string local_40 [56];
  char *local_8;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_8 = (char *)std::__cxx11::string::c_str();
  }
  else {
    std::runtime_error::what();
    std::__cxx11::string::append((char *)(in_RDI + 0x30));
    if ((*(long *)(in_RDI + 0x20) == 0) || (*(long *)(in_RDI + 0x28) == 0)) {
      if (*(long *)(in_RDI + 0x28) != 0) {
        std::__cxx11::string::append((char *)(in_RDI + 0x30));
        std::__cxx11::to_string(in_stack_ffffffffffffff98);
        std::__cxx11::string::append((string *)(in_RDI + 0x30));
        std::__cxx11::string::~string(local_80);
      }
    }
    else {
      std::__cxx11::string::append((char *)(in_RDI + 0x30));
      std::__cxx11::to_string(in_stack_ffffffffffffff98);
      std::__cxx11::string::append((string *)(in_RDI + 0x30));
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::append((char *)(in_RDI + 0x30));
      std::__cxx11::to_string(in_stack_ffffffffffffff98);
      std::__cxx11::string::append((string *)(in_RDI + 0x30));
      std::__cxx11::string::~string(local_60);
    }
    local_8 = (char *)std::__cxx11::string::c_str();
  }
  return local_8;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::system_error::what());
                    if (line_number_ != 0 && column_number_ != 0)
                    {
                        what_.append(" at line ");
                        what_.append(std::to_string(line_number_));
                        what_.append(" and column ");
                        what_.append(std::to_string(column_number_));
                    }
                    else if (column_number_ != 0)
                    {
                        what_.append(" at position ");
                        what_.append(std::to_string(column_number_));
                    }
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::system_error::what();
                }
            }